

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O0

Maybe<unsigned_int_&> __thiscall
kj::Table<unsigned_int,kj::HashIndex<kj::_::(anonymous_namespace)::UintHasher>>::
find<0ul,unsigned_int>
          (Table<unsigned_int,kj::HashIndex<kj::_::(anonymous_namespace)::UintHasher>> *this,
          StringPtr *params)

{
  HashIndex<kj::_::(anonymous_namespace)::StringHasher> *pHVar1;
  NullableValue<unsigned_long> *other;
  unsigned_long *puVar2;
  StringPtr *t;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 in_RDX;
  ArrayPtr<unsigned_int>_conflict AVar3;
  unsigned_long *pos;
  StringPtr *local_50;
  StringPtr *local_48;
  Maybe<unsigned_long> local_40;
  undefined1 local_30 [8];
  NullableValue<unsigned_long> _pos583;
  StringPtr *params_local;
  Table<kj::StringPtr,_kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>_> *this_local;
  
  _pos583.field_1 = in_RDX;
  pHVar1 = get<0ul,kj::HashIndex<kj::_::(anonymous_namespace)::UintHasher>&>
                     ((HashIndex<kj::_::(anonymous_namespace)::StringHasher> *)(params + 2));
  AVar3 = Vector<unsigned_int>::asPtr((Vector<unsigned_int> *)params);
  fwd<unsigned_int>((NoInfer<unsigned_int> *)_pos583.field_1);
  local_50 = AVar3.ptr;
  local_48 = (StringPtr *)AVar3.size_;
  AVar3.size_ = (size_t)local_50;
  AVar3.ptr = (StringPtr *)pHVar1;
  HashIndex<kj::_::(anonymous_namespace)::UintHasher>::find<unsigned_int,unsigned_int>
            ((HashIndex<kj::_::(anonymous_namespace)::UintHasher> *)&local_40,AVar3,local_48);
  other = kj::_::readMaybe<unsigned_long>(&local_40);
  kj::_::NullableValue<unsigned_long>::NullableValue((NullableValue<unsigned_long> *)local_30,other)
  ;
  Maybe<unsigned_long>::~Maybe(&local_40);
  puVar2 = kj::_::NullableValue::operator_cast_to_unsigned_long_((NullableValue *)local_30);
  if (puVar2 == (unsigned_long *)0x0) {
    Maybe<unsigned_int_&>::Maybe((Maybe<unsigned_int_&> *)this);
  }
  else {
    puVar2 = kj::_::NullableValue<unsigned_long>::operator*
                       ((NullableValue<unsigned_long> *)local_30);
    t = Vector<unsigned_int>::operator[]((Vector<unsigned_int> *)params,*puVar2);
    Maybe<unsigned_int_&>::Maybe((Maybe<unsigned_int_&> *)this,t);
  }
  kj::_::NullableValue<unsigned_long>::~NullableValue((NullableValue<unsigned_long> *)local_30);
  return (Maybe<unsigned_int_&>)(StringPtr *)this;
}

Assistant:

kj::Maybe<Row&> Table<Row, Indexes...>::find(Params&&... params) {
  KJ_IF_SOME(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[pos];
  } else {
    return kj::none;
  }
}